

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::valid_name_string(string *str)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  int local_54;
  char c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  iterator __end2;
  iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  string *str_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&__begin2,(ulong)str);
      __end2._M_current = (char *)::std::__cxx11::string::begin();
      _Stack_50._M_current = (char *)::std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
        if (!bVar1) break;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        bVar1 = valid_later_char<char>(*pcVar4);
        if (!bVar1) {
          str_local._7_1_ = 0;
          local_54 = 1;
          goto LAB_00120046;
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      local_54 = 2;
LAB_00120046:
      ::std::__cxx11::string::~string((string *)&__begin2);
      if (local_54 != 1) {
        str_local._7_1_ = 1;
      }
      goto LAB_0012005d;
    }
  }
  str_local._7_1_ = 0;
LAB_0012005d:
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

inline bool valid_name_string(const std::string &str) {
    if(str.empty() || !valid_first_char(str[0]))
        return false;
    for(auto c : str.substr(1))
        if(!valid_later_char(c))
            return false;
    return true;
}